

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor * ggml_graph_get_parent(ggml_cgraph *cgraph,ggml_tensor *node)

{
  ggml_tensor *pgVar1;
  ggml_tensor *in_RSI;
  long in_RDI;
  ggml_tensor *grad;
  ggml_tensor *parent;
  int i;
  ggml_tensor *node_00;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 4) <= iVar2) {
      return (ggml_tensor *)0x0;
    }
    node_00 = *(ggml_tensor **)(*(long *)(in_RDI + 0x10) + (long)iVar2 * 8);
    pgVar1 = ggml_graph_get_grad((ggml_cgraph *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),node_00);
    if (pgVar1 == in_RSI) break;
    iVar2 = iVar2 + 1;
  }
  return node_00;
}

Assistant:

static struct ggml_tensor * ggml_graph_get_parent(const struct ggml_cgraph * cgraph, const struct ggml_tensor * node) {
    for (int i = 0; i < cgraph->n_nodes; i++) {
        struct ggml_tensor * parent = cgraph->nodes[i];
        struct ggml_tensor * grad = ggml_graph_get_grad(cgraph, parent);

        if (grad == node) {
            return parent;
        }
    }

    return NULL;
}